

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.cpp
# Opt level: O0

void __thiscall IOContextDemuxer::setFileIterator(IOContextDemuxer *this,FileNameIterator *itr)

{
  VodCoreException *this_00;
  BufferedReader *local_1e8;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  BufferedReader *br;
  FileNameIterator *itr_local;
  IOContextDemuxer *this_local;
  
  if (this->m_bufferedReader == (AbstractReader *)0x0) {
    local_1e8 = (BufferedReader *)0x0;
  }
  else {
    local_1e8 = (BufferedReader *)
                __dynamic_cast(this->m_bufferedReader,&AbstractReader::typeinfo,
                               &BufferedReader::typeinfo,0);
  }
  if (local_1e8 == (BufferedReader *)0x0) {
    if (itr != (FileNameIterator *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,
                      "Can not set file iterator. Reader does not support bufferedReader interface."
                     );
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,3,&local_1c8);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
  }
  else {
    BufferedReader::setFileIterator(local_1e8,itr,this->m_readerID);
  }
  return;
}

Assistant:

void IOContextDemuxer::setFileIterator(FileNameIterator* itr)
{
    const auto br = dynamic_cast<BufferedReader*>(m_bufferedReader);
    if (br)
        br->setFileIterator(itr, m_readerID);
    else if (itr != nullptr)
        THROW(ERR_COMMON, "Can not set file iterator. Reader does not support bufferedReader interface.")
}